

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

wstring * __thiscall
Centaurus::Stream::cut(wstring *__return_storage_ptr__,Stream *this,Sentry *sentry)

{
  allocator<wchar_t> local_31;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_30;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_28;
  Sentry *local_20;
  Sentry *sentry_local;
  Stream *this_local;
  
  local_28._M_current = sentry->_M_current;
  local_20 = sentry;
  sentry_local = (Sentry *)this;
  this_local = (Stream *)__return_storage_ptr__;
  __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::__normal_iterator<wchar_t*>
            ((__normal_iterator<wchar_t_const*,std::__cxx11::wstring> *)&local_30,&this->m_cur);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::
  wstring<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,void>
            ((wstring *)__return_storage_ptr__,local_28,local_30,&local_31);
  std::allocator<wchar_t>::~allocator(&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::wstring cut(const Sentry& sentry)
    {
        return std::wstring(static_cast<std::wstring::const_iterator>(sentry), static_cast<std::wstring::const_iterator>(m_cur));
    }